

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

OptionResult * option_parser_next(OptionResult *__return_storage_ptr__,OptionParser *parser)

{
  int iVar1;
  int iVar2;
  char **ppcVar3;
  Option *pOVar4;
  int iVar5;
  size_t __n;
  Option *pOVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  bool bVar14;
  
  iVar1 = parser->arg_index;
  iVar2 = parser->argc;
  if (iVar2 <= iVar1) {
    __return_storage_ptr__->kind = OPTION_RESULT_KIND_DONE;
    __return_storage_ptr__->option = (Option *)0x0;
    (__return_storage_ptr__->field_2).value = (char *)0x0;
    return __return_storage_ptr__;
  }
  ppcVar3 = parser->argv;
  iVar13 = iVar1 + 1;
  parser->arg_index = iVar13;
  pcVar9 = ppcVar3[iVar1];
  if (*pcVar9 == '-') {
    sVar10 = parser->num_options;
    if (pcVar9[1] == '-') {
      lVar12 = 0;
      while (bVar14 = sVar10 != 0, sVar10 = sVar10 - 1, bVar14) {
        pOVar4 = parser->options;
        pcVar8 = *(char **)((long)&pOVar4->long_name + lVar12);
        if (pcVar8 != (char *)0x0) {
          __n = strlen(pcVar8);
          iVar5 = strncmp(pcVar9 + 2,pcVar8,__n);
          if (iVar5 == 0) {
            pOVar6 = (Option *)(&pOVar4->short_name + lVar12);
            if (*(int *)((long)&pOVar4->has_value + lVar12) == 0) goto LAB_00181b1e;
            if (pcVar9[__n + 2] == '=') {
              bVar14 = pcVar9[__n + 3] != '\0';
              pcVar8 = (char *)0x0;
              if (bVar14) {
                pcVar8 = pcVar9 + __n + 3;
              }
              __return_storage_ptr__->kind = bVar14 + 1 + (uint)bVar14;
              __return_storage_ptr__->option = pOVar6;
              (__return_storage_ptr__->field_2).value = pcVar8;
              return __return_storage_ptr__;
            }
            if (iVar2 <= iVar13) goto LAB_00181b65;
            parser->arg_index = iVar1 + 2;
            pcVar9 = ppcVar3[(long)iVar1 + 1];
            goto LAB_00181b46;
          }
        }
        lVar12 = lVar12 + 0x18;
      }
LAB_00181a87:
      __return_storage_ptr__->kind = OPTION_RESULT_KIND_UNKNOWN;
      __return_storage_ptr__->option = (Option *)0x0;
      (__return_storage_ptr__->field_2).value = pcVar9;
      return __return_storage_ptr__;
    }
    lVar11 = sVar10 + 1;
    lVar12 = -0x18;
    do {
      lVar7 = lVar12;
      lVar11 = lVar11 + -1;
      if (lVar11 == 0) goto LAB_00181a87;
      pOVar4 = parser->options;
      lVar12 = lVar7 + 0x18;
    } while (((&pOVar4[1].short_name)[lVar7] == '\0') ||
            ((&pOVar4[1].short_name)[lVar7] != pcVar9[1]));
    pOVar6 = (Option *)(&pOVar4[1].short_name + lVar7);
    if (pcVar9[2] == '\0') {
      if (*(int *)((long)&pOVar4[1].has_value + lVar7) == 0) {
LAB_00181b1e:
        __return_storage_ptr__->kind = OPTION_RESULT_KIND_OPTION;
      }
      else {
        if (iVar13 < iVar2) {
          parser->arg_index = iVar1 + 2;
          pcVar9 = ppcVar3[iVar13];
LAB_00181b46:
          bVar14 = *pcVar9 != '\0';
          pcVar8 = (char *)0x0;
          if (bVar14) {
            pcVar8 = pcVar9;
          }
          __return_storage_ptr__->kind = bVar14 + 1 + (uint)bVar14;
          __return_storage_ptr__->option = pOVar6;
          (__return_storage_ptr__->field_2).value = pcVar8;
          return __return_storage_ptr__;
        }
LAB_00181b65:
        __return_storage_ptr__->kind = OPTION_RESULT_KIND_EXPECTED_VALUE;
      }
      __return_storage_ptr__->option = pOVar6;
      (__return_storage_ptr__->field_2).value = (char *)0x0;
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->kind = OPTION_RESULT_KIND_BAD_SHORT_OPTION;
    __return_storage_ptr__->option = pOVar6;
  }
  else {
    __return_storage_ptr__->kind = OPTION_RESULT_KIND_ARG;
    __return_storage_ptr__->option = (Option *)0x0;
  }
  (__return_storage_ptr__->field_2).value = pcVar9;
  return __return_storage_ptr__;
}

Assistant:

OptionResult option_parser_next(OptionParser* parser) {
  if (parser->arg_index >= parser->argc) {
    return make_option_result(OPTION_RESULT_KIND_DONE, NULL, NULL);
  }

  char* arg = parser->argv[parser->arg_index++];
  if (arg[0] == '-') {
    size_t i;
    if (arg[1] == '-') {
      /* Long option. */
      for (i = 0; i < parser->num_options; ++i) {
        const Option* option = &parser->options[i];
        if (!option->long_name) {
          continue;
        }

        size_t long_name_len = strlen(option->long_name);
        if (strncmp(&arg[2], option->long_name, long_name_len) == 0) {
          if (option->has_value) {
            if (arg[2 + long_name_len] == '=') {
              char* value = &arg[2 + long_name_len + 1];
              return make_option_result_with_value(OPTION_RESULT_KIND_OPTION,
                                                   option, value);
            } else {
              if (parser->arg_index >= parser->argc) {
                return make_option_result(OPTION_RESULT_KIND_EXPECTED_VALUE,
                                          option, NULL);
              }

              char* value = parser->argv[parser->arg_index++];
              return make_option_result_with_value(OPTION_RESULT_KIND_OPTION,
                                                   option, value);
            }
          } else {
            return make_option_result(OPTION_RESULT_KIND_OPTION, option, NULL);
          }
        }
      }
    } else {
      /* Short option. */
      for (i = 0; i < parser->num_options; ++i) {
        const Option* option = &parser->options[i];
        if (!option->short_name) {
          continue;
        }

        if (option->short_name == arg[1]) {
          if (arg[2] == 0) {
            if (option->has_value) {
              if (parser->arg_index >= parser->argc) {
                return make_option_result(OPTION_RESULT_KIND_EXPECTED_VALUE,
                                          option, NULL);
              }

              char* value = parser->argv[parser->arg_index++];
              return make_option_result_with_value(OPTION_RESULT_KIND_OPTION,
                                                   option, value);
            } else {
              return make_option_result(OPTION_RESULT_KIND_OPTION, option,
                                        NULL);
            }
          } else {
            return make_option_result(OPTION_RESULT_KIND_BAD_SHORT_OPTION,
                                      option, arg);
          }
        }
      }
    }

    return make_option_result(OPTION_RESULT_KIND_UNKNOWN, NULL, arg);
  } else {
    /* Argument. */
    return make_option_result(OPTION_RESULT_KIND_ARG, NULL, arg);
  }
}